

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O3

void InitParameterInteraction(ArgsManager *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *ppbVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  Network NVar7;
  int64_t iVar8;
  long lVar9;
  long lVar10;
  pointer net_in;
  string *psVar11;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view source_file_08;
  string_view source_file_09;
  string_view source_file_10;
  string_view source_file_11;
  string_view source_file_12;
  string_view source_file_13;
  string_view source_file_14;
  string_view source_file_15;
  string_view source_file_16;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view logging_function_08;
  string_view logging_function_09;
  string_view logging_function_10;
  string_view logging_function_11;
  string_view logging_function_12;
  string_view logging_function_13;
  string_view logging_function_14;
  string_view logging_function_15;
  string_view logging_function_16;
  uint *in_stack_ffffffffffffff58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  onlynets;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  string proxy_arg;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &proxy_arg.field_2;
  proxy_arg._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&proxy_arg,"-bind","");
  bVar4 = ArgsManager::IsArgSet(args,&proxy_arg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)proxy_arg._M_dataplus._M_p != paVar1) {
    operator_delete(proxy_arg._M_dataplus._M_p,proxy_arg.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    proxy_arg._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&proxy_arg,"-listen","");
    bVar4 = ArgsManager::SoftSetBoolArg(args,&proxy_arg,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)proxy_arg._M_dataplus._M_p != paVar1) {
      operator_delete(proxy_arg._M_dataplus._M_p,proxy_arg.field_2._M_allocated_capacity + 1);
    }
    if (bVar4) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp";
      source_file._M_len = 0x51;
      logging_function._M_str = "InitParameterInteraction";
      logging_function._M_len = 0x18;
      LogPrintf_<>(logging_function,source_file,0x2e6,ALL,Info,
                   "parameter interaction: -bind set -> setting -listen=1\n");
    }
  }
  proxy_arg._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&proxy_arg,"-whitebind","");
  bVar4 = ArgsManager::IsArgSet(args,&proxy_arg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)proxy_arg._M_dataplus._M_p != paVar1) {
    operator_delete(proxy_arg._M_dataplus._M_p,proxy_arg.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    proxy_arg._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&proxy_arg,"-listen","");
    bVar4 = ArgsManager::SoftSetBoolArg(args,&proxy_arg,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)proxy_arg._M_dataplus._M_p != paVar1) {
      operator_delete(proxy_arg._M_dataplus._M_p,proxy_arg.field_2._M_allocated_capacity + 1);
    }
    if (bVar4) {
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp";
      source_file_00._M_len = 0x51;
      logging_function_00._M_str = "InitParameterInteraction";
      logging_function_00._M_len = 0x18;
      LogPrintf_<>(logging_function_00,source_file_00,0x2ea,ALL,Info,
                   "parameter interaction: -whitebind set -> setting -listen=1\n");
    }
  }
  proxy_arg._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&proxy_arg,"-connect","");
  bVar5 = ArgsManager::IsArgSet(args,&proxy_arg);
  bVar4 = true;
  if (!bVar5) {
    local_78._M_allocated_capacity = (size_type)&local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-maxconnections","");
    iVar8 = ArgsManager::GetIntArg(args,(string *)&local_78,0x7d);
    bVar4 = iVar8 < 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_allocated_capacity != &local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)proxy_arg._M_dataplus._M_p != paVar1) {
    operator_delete(proxy_arg._M_dataplus._M_p,proxy_arg.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    proxy_arg._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&proxy_arg,"-dnsseed","");
    bVar4 = ArgsManager::SoftSetBoolArg(args,&proxy_arg,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)proxy_arg._M_dataplus._M_p != paVar1) {
      operator_delete(proxy_arg._M_dataplus._M_p,proxy_arg.field_2._M_allocated_capacity + 1);
    }
    if (bVar4) {
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp";
      source_file_01._M_len = 0x51;
      logging_function_01._M_str = "InitParameterInteraction";
      logging_function_01._M_len = 0x18;
      LogPrintf_<>(logging_function_01,source_file_01,0x2f0,ALL,Info,
                   "parameter interaction: -connect or -maxconnections=0 set -> setting -dnsseed=0\n"
                  );
    }
    proxy_arg._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&proxy_arg,"-listen","");
    bVar4 = ArgsManager::SoftSetBoolArg(args,&proxy_arg,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)proxy_arg._M_dataplus._M_p != paVar1) {
      operator_delete(proxy_arg._M_dataplus._M_p,proxy_arg.field_2._M_allocated_capacity + 1);
    }
    if (bVar4) {
      source_file_02._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp";
      source_file_02._M_len = 0x51;
      logging_function_02._M_str = "InitParameterInteraction";
      logging_function_02._M_len = 0x18;
      LogPrintf_<>(logging_function_02,source_file_02,0x2f2,ALL,Info,
                   "parameter interaction: -connect or -maxconnections=0 set -> setting -listen=0\n"
                  );
    }
  }
  local_78._M_allocated_capacity = (size_type)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-proxy","");
  ppbVar2 = &onlynets.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  onlynets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&onlynets,"");
  ArgsManager::GetArg(&proxy_arg,args,(string *)&local_78,(string *)&onlynets);
  if (onlynets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar2) {
    operator_delete(onlynets.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((onlynets.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_allocated_capacity != &local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
  }
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&proxy_arg,"");
  if ((iVar6 != 0) &&
     (iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&proxy_arg,"0"), iVar6 != 0)) {
    local_78._M_allocated_capacity = (size_type)&local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-listen","");
    bVar4 = ArgsManager::SoftSetBoolArg(args,(string *)&local_78,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_allocated_capacity != &local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
    }
    if (bVar4) {
      source_file_03._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp";
      source_file_03._M_len = 0x51;
      logging_function_03._M_str = "InitParameterInteraction";
      logging_function_03._M_len = 0x18;
      LogPrintf_<>(logging_function_03,source_file_03,0x2f9,ALL,Info,
                   "parameter interaction: -proxy set -> setting -listen=0\n");
    }
    local_78._M_allocated_capacity = (size_type)&local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-upnp","");
    bVar4 = ArgsManager::SoftSetBoolArg(args,(string *)&local_78,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_allocated_capacity != &local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
    }
    if (bVar4) {
      source_file_04._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp";
      source_file_04._M_len = 0x51;
      logging_function_04._M_str = "InitParameterInteraction";
      logging_function_04._M_len = 0x18;
      LogPrintf_<>(logging_function_04,source_file_04,0x2fd,ALL,Info,
                   "parameter interaction: -proxy set -> setting -upnp=0\n");
    }
    local_78._M_allocated_capacity = (size_type)&local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-natpmp","");
    bVar4 = ArgsManager::SoftSetBoolArg(args,(string *)&local_78,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_allocated_capacity != &local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
    }
    if (bVar4) {
      source_file_05._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp";
      source_file_05._M_len = 0x51;
      logging_function_05._M_str = "InitParameterInteraction";
      logging_function_05._M_len = 0x18;
      LogPrintf_<>(logging_function_05,source_file_05,0x2ff,ALL,Info,
                   "parameter interaction: -proxy set -> setting -natpmp=0\n");
    }
    local_78._M_allocated_capacity = (size_type)&local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-discover","");
    bVar4 = ArgsManager::SoftSetBoolArg(args,(string *)&local_78,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_allocated_capacity != &local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
    }
    if (bVar4) {
      source_file_06._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp";
      source_file_06._M_len = 0x51;
      logging_function_06._M_str = "InitParameterInteraction";
      logging_function_06._M_len = 0x18;
      LogPrintf_<>(logging_function_06,source_file_06,0x303,ALL,Info,
                   "parameter interaction: -proxy set -> setting -discover=0\n");
    }
  }
  local_78._M_allocated_capacity = (size_type)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-listen","");
  bVar4 = ArgsManager::GetBoolArg(args,(string *)&local_78,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_allocated_capacity != &local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
  }
  if (!bVar4) {
    local_78._M_allocated_capacity = (size_type)&local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-upnp","");
    bVar4 = ArgsManager::SoftSetBoolArg(args,(string *)&local_78,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_allocated_capacity != &local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
    }
    if (bVar4) {
      source_file_07._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp";
      source_file_07._M_len = 0x51;
      logging_function_07._M_str = "InitParameterInteraction";
      logging_function_07._M_len = 0x18;
      LogPrintf_<>(logging_function_07,source_file_07,0x309,ALL,Info,
                   "parameter interaction: -listen=0 -> setting -upnp=0\n");
    }
    local_78._M_allocated_capacity = (size_type)&local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-natpmp","");
    bVar4 = ArgsManager::SoftSetBoolArg(args,(string *)&local_78,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_allocated_capacity != &local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
    }
    if (bVar4) {
      source_file_08._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp";
      source_file_08._M_len = 0x51;
      logging_function_08._M_str = "InitParameterInteraction";
      logging_function_08._M_len = 0x18;
      LogPrintf_<>(logging_function_08,source_file_08,0x30b,ALL,Info,
                   "parameter interaction: -listen=0 -> setting -natpmp=0\n");
    }
    local_78._M_allocated_capacity = (size_type)&local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-discover","");
    bVar4 = ArgsManager::SoftSetBoolArg(args,(string *)&local_78,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_allocated_capacity != &local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
    }
    if (bVar4) {
      source_file_09._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp";
      source_file_09._M_len = 0x51;
      logging_function_09._M_str = "InitParameterInteraction";
      logging_function_09._M_len = 0x18;
      LogPrintf_<>(logging_function_09,source_file_09,0x30e,ALL,Info,
                   "parameter interaction: -listen=0 -> setting -discover=0\n");
    }
    local_78._M_allocated_capacity = (size_type)&local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-listenonion","");
    bVar4 = ArgsManager::SoftSetBoolArg(args,(string *)&local_78,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_allocated_capacity != &local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
    }
    if (bVar4) {
      source_file_10._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp";
      source_file_10._M_len = 0x51;
      logging_function_10._M_str = "InitParameterInteraction";
      logging_function_10._M_len = 0x18;
      LogPrintf_<>(logging_function_10,source_file_10,0x310,ALL,Info,
                   "parameter interaction: -listen=0 -> setting -listenonion=0\n");
    }
    local_78._M_allocated_capacity = (size_type)&local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-i2pacceptincoming","");
    bVar4 = ArgsManager::SoftSetBoolArg(args,(string *)&local_78,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_allocated_capacity != &local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
    }
    if (bVar4) {
      source_file_11._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp";
      source_file_11._M_len = 0x51;
      logging_function_11._M_str = "InitParameterInteraction";
      logging_function_11._M_len = 0x18;
      LogPrintf_<>(logging_function_11,source_file_11,0x312,ALL,Info,
                   "parameter interaction: -listen=0 -> setting -i2pacceptincoming=0\n");
    }
  }
  local_78._M_allocated_capacity = (size_type)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-externalip","");
  bVar4 = ArgsManager::IsArgSet(args,(string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_allocated_capacity != &local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
  }
  if (bVar4) {
    local_78._M_allocated_capacity = (size_type)&local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-discover","");
    bVar4 = ArgsManager::SoftSetBoolArg(args,(string *)&local_78,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_allocated_capacity != &local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
    }
    if (bVar4) {
      source_file_12._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp";
      source_file_12._M_len = 0x51;
      logging_function_12._M_str = "InitParameterInteraction";
      logging_function_12._M_len = 0x18;
      LogPrintf_<>(logging_function_12,source_file_12,0x319,ALL,Info,
                   "parameter interaction: -externalip set -> setting -discover=0\n");
    }
  }
  local_78._M_allocated_capacity = (size_type)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-blocksonly","");
  bVar4 = ArgsManager::GetBoolArg(args,(string *)&local_78,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_allocated_capacity != &local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
  }
  if (bVar4) {
    local_78._M_allocated_capacity = (size_type)&local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-whitelistrelay","");
    bVar4 = ArgsManager::SoftSetBoolArg(args,(string *)&local_78,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_allocated_capacity != &local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
    }
    if (bVar4) {
      source_file_13._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp";
      source_file_13._M_len = 0x51;
      logging_function_13._M_str = "InitParameterInteraction";
      logging_function_13._M_len = 0x18;
      LogPrintf_<>(logging_function_13,source_file_13,799,ALL,Info,
                   "parameter interaction: -blocksonly=1 -> setting -whitelistrelay=0\n");
    }
    local_78._M_allocated_capacity = (size_type)&local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-maxmempool","");
    util::ToString<unsigned_int>((string *)&onlynets,&DEFAULT_BLOCKSONLY_MAX_MEMPOOL_SIZE_MB);
    bVar4 = ArgsManager::SoftSetArg(args,(string *)&local_78,(string *)&onlynets);
    if (onlynets.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar2) {
      operator_delete(onlynets.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((onlynets.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_allocated_capacity != &local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
    }
    if (bVar4) {
      source_file_14._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp";
      source_file_14._M_len = 0x51;
      logging_function_14._M_str = "InitParameterInteraction";
      logging_function_14._M_len = 0x18;
      LogPrintf_<unsigned_int>
                (logging_function_14,source_file_14,0x322,TOR,0xf9e83e,
                 (char *)&DEFAULT_BLOCKSONLY_MAX_MEMPOOL_SIZE_MB,in_stack_ffffffffffffff58);
    }
  }
  local_78._M_allocated_capacity = (size_type)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-whitelistforcerelay","");
  bVar4 = ArgsManager::GetBoolArg(args,(string *)&local_78,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_allocated_capacity != &local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
  }
  if (bVar4) {
    local_78._M_allocated_capacity = (size_type)&local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-whitelistrelay","");
    bVar4 = ArgsManager::SoftSetBoolArg(args,(string *)&local_78,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_allocated_capacity != &local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
    }
    if (bVar4) {
      source_file_15._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp";
      source_file_15._M_len = 0x51;
      logging_function_15._M_str = "InitParameterInteraction";
      logging_function_15._M_len = 0x18;
      LogPrintf_<>(logging_function_15,source_file_15,0x328,ALL,Info,
                   "parameter interaction: -whitelistforcerelay=1 -> setting -whitelistrelay=1\n");
    }
  }
  local_78._M_allocated_capacity = (size_type)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-onlynet","");
  bVar4 = ArgsManager::IsArgSet(args,(string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_allocated_capacity != &local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
  }
  if (!bVar4) goto LAB_0089b069;
  local_78._M_allocated_capacity = (size_type)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-onlynet","");
  ArgsManager::GetArgs(&onlynets,args,(string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_allocated_capacity != &local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
  }
  lVar10 = (long)onlynets.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)onlynets.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  net_in = onlynets.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < lVar10 >> 7) {
    lVar9 = (lVar10 >> 7) + 1;
    do {
      NVar7 = ParseNetwork(net_in);
      psVar11 = net_in;
      if (NVar7 - NET_IPV4 < 2) goto LAB_0089afdb;
      NVar7 = ParseNetwork(net_in + 1);
      psVar11 = net_in + 1;
      if (NVar7 - NET_IPV4 < 2) goto LAB_0089afdb;
      NVar7 = ParseNetwork(net_in + 2);
      psVar11 = net_in + 2;
      if (NVar7 - NET_IPV4 < 2) goto LAB_0089afdb;
      NVar7 = ParseNetwork(net_in + 3);
      psVar11 = net_in + 3;
      if (NVar7 - NET_IPV4 < 2) goto LAB_0089afdb;
      net_in = net_in + 4;
      lVar9 = lVar9 + -1;
      lVar10 = lVar10 + -0x80;
    } while (1 < lVar9);
  }
  lVar10 = lVar10 >> 5;
  if (lVar10 == 1) {
LAB_0089afc7:
    NVar7 = ParseNetwork(net_in);
    psVar11 = net_in;
    if (1 < NVar7 - NET_IPV4) {
      psVar11 = onlynets.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
LAB_0089afdb:
    if (psVar11 ==
        onlynets.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0089afe0;
  }
  else {
    if (lVar10 == 2) {
LAB_0089afa8:
      NVar7 = ParseNetwork(net_in);
      psVar11 = net_in;
      if (1 < NVar7 - NET_IPV4) {
        net_in = net_in + 1;
        goto LAB_0089afc7;
      }
      goto LAB_0089afdb;
    }
    if (lVar10 == 3) {
      NVar7 = ParseNetwork(net_in);
      psVar11 = net_in;
      if (1 < NVar7 - NET_IPV4) {
        net_in = net_in + 1;
        goto LAB_0089afa8;
      }
      goto LAB_0089afdb;
    }
LAB_0089afe0:
    local_78._M_allocated_capacity = (size_type)&local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-dnsseed","");
    bVar4 = ArgsManager::SoftSetBoolArg(args,(string *)&local_78,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_allocated_capacity != &local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
    }
    if (bVar4) {
      source_file_16._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp";
      source_file_16._M_len = 0x51;
      logging_function_16._M_str = "InitParameterInteraction";
      logging_function_16._M_len = 0x18;
      LogPrintf_<>(logging_function_16,source_file_16,0x331,ALL,Info,
                   "parameter interaction: -onlynet excludes IPv4 and IPv6 -> setting -dnsseed=0\n")
      ;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&onlynets);
LAB_0089b069:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)proxy_arg._M_dataplus._M_p != &proxy_arg.field_2) {
    operator_delete(proxy_arg._M_dataplus._M_p,proxy_arg.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void InitParameterInteraction(ArgsManager& args)
{
    // when specifying an explicit binding address, you want to listen on it
    // even when -connect or -proxy is specified
    if (args.IsArgSet("-bind")) {
        if (args.SoftSetBoolArg("-listen", true))
            LogInfo("parameter interaction: -bind set -> setting -listen=1\n");
    }
    if (args.IsArgSet("-whitebind")) {
        if (args.SoftSetBoolArg("-listen", true))
            LogInfo("parameter interaction: -whitebind set -> setting -listen=1\n");
    }

    if (args.IsArgSet("-connect") || args.GetIntArg("-maxconnections", DEFAULT_MAX_PEER_CONNECTIONS) <= 0) {
        // when only connecting to trusted nodes, do not seed via DNS, or listen by default
        if (args.SoftSetBoolArg("-dnsseed", false))
            LogInfo("parameter interaction: -connect or -maxconnections=0 set -> setting -dnsseed=0\n");
        if (args.SoftSetBoolArg("-listen", false))
            LogInfo("parameter interaction: -connect or -maxconnections=0 set -> setting -listen=0\n");
    }

    std::string proxy_arg = args.GetArg("-proxy", "");
    if (proxy_arg != "" && proxy_arg != "0") {
        // to protect privacy, do not listen by default if a default proxy server is specified
        if (args.SoftSetBoolArg("-listen", false))
            LogInfo("parameter interaction: -proxy set -> setting -listen=0\n");
        // to protect privacy, do not map ports when a proxy is set. The user may still specify -listen=1
        // to listen locally, so don't rely on this happening through -listen below.
        if (args.SoftSetBoolArg("-upnp", false))
            LogInfo("parameter interaction: -proxy set -> setting -upnp=0\n");
        if (args.SoftSetBoolArg("-natpmp", false)) {
            LogInfo("parameter interaction: -proxy set -> setting -natpmp=0\n");
        }
        // to protect privacy, do not discover addresses by default
        if (args.SoftSetBoolArg("-discover", false))
            LogInfo("parameter interaction: -proxy set -> setting -discover=0\n");
    }

    if (!args.GetBoolArg("-listen", DEFAULT_LISTEN)) {
        // do not map ports or try to retrieve public IP when not listening (pointless)
        if (args.SoftSetBoolArg("-upnp", false))
            LogInfo("parameter interaction: -listen=0 -> setting -upnp=0\n");
        if (args.SoftSetBoolArg("-natpmp", false)) {
            LogInfo("parameter interaction: -listen=0 -> setting -natpmp=0\n");
        }
        if (args.SoftSetBoolArg("-discover", false))
            LogInfo("parameter interaction: -listen=0 -> setting -discover=0\n");
        if (args.SoftSetBoolArg("-listenonion", false))
            LogInfo("parameter interaction: -listen=0 -> setting -listenonion=0\n");
        if (args.SoftSetBoolArg("-i2pacceptincoming", false)) {
            LogInfo("parameter interaction: -listen=0 -> setting -i2pacceptincoming=0\n");
        }
    }

    if (args.IsArgSet("-externalip")) {
        // if an explicit public IP is specified, do not try to find others
        if (args.SoftSetBoolArg("-discover", false))
            LogInfo("parameter interaction: -externalip set -> setting -discover=0\n");
    }

    if (args.GetBoolArg("-blocksonly", DEFAULT_BLOCKSONLY)) {
        // disable whitelistrelay in blocksonly mode
        if (args.SoftSetBoolArg("-whitelistrelay", false))
            LogInfo("parameter interaction: -blocksonly=1 -> setting -whitelistrelay=0\n");
        // Reduce default mempool size in blocksonly mode to avoid unexpected resource usage
        if (args.SoftSetArg("-maxmempool", ToString(DEFAULT_BLOCKSONLY_MAX_MEMPOOL_SIZE_MB)))
            LogInfo("parameter interaction: -blocksonly=1 -> setting -maxmempool=%d\n", DEFAULT_BLOCKSONLY_MAX_MEMPOOL_SIZE_MB);
    }

    // Forcing relay from whitelisted hosts implies we will accept relays from them in the first place.
    if (args.GetBoolArg("-whitelistforcerelay", DEFAULT_WHITELISTFORCERELAY)) {
        if (args.SoftSetBoolArg("-whitelistrelay", true))
            LogInfo("parameter interaction: -whitelistforcerelay=1 -> setting -whitelistrelay=1\n");
    }
    if (args.IsArgSet("-onlynet")) {
        const auto onlynets = args.GetArgs("-onlynet");
        bool clearnet_reachable = std::any_of(onlynets.begin(), onlynets.end(), [](const auto& net) {
            const auto n = ParseNetwork(net);
            return n == NET_IPV4 || n == NET_IPV6;
        });
        if (!clearnet_reachable && args.SoftSetBoolArg("-dnsseed", false)) {
            LogInfo("parameter interaction: -onlynet excludes IPv4 and IPv6 -> setting -dnsseed=0\n");
        }
    }
}